

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::it_failed(info *this,string *desc,assertion_exception *ex)

{
  int *piVar1;
  failure_formatter_t *pfVar2;
  context_info *pcVar3;
  ostream *poVar4;
  _Elt_pointer pcVar5;
  stringstream ss;
  string sStack_208;
  string local_1e8 [32];
  string local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_failed_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::stringstream::stringstream(local_1a8);
  progress_base::current_context_name_abi_cxx11_(&sStack_208,(progress_base *)this);
  poVar4 = std::operator<<(local_198,(string *)&sStack_208);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,(string *)desc);
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  pfVar2 = (this->super_colored_base).super_progress_base.failure_formatter_;
  (*pfVar2->_vptr_interface[2])(local_1e8,pfVar2,ex);
  std::operator<<(poVar4,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::stringbuf::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_colored_base).super_progress_base.failures_,&sStack_208);
  std::__cxx11::string::~string((string *)&sStack_208);
  pcVar5 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar5 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar3 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
    piVar1 = &pcVar3[9].total;
    *piVar1 = *piVar1 + 1;
    pcVar5 = pcVar3 + 10;
  }
  else {
    pcVar5[-1].total = pcVar5[-1].total + 1;
  }
  pcVar5[-1].failed = pcVar5[-1].failed + 1;
  this->indentation_ = this->indentation_ + -1;
  poVar4 = std::operator<<((this->super_colored_base).stm_,"\r");
  indent_abi_cxx11_(&sStack_208,this);
  poVar4 = std::operator<<(poVar4,(string *)&sStack_208);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_1e8);
  poVar4 = std::operator<<(poVar4,local_1e8);
  poVar4 = std::operator<<(poVar4,"[ FAIL ]");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_1c8);
  poVar4 = std::operator<<(poVar4,local_1c8);
  poVar4 = std::operator<<(poVar4," it ");
  poVar4 = std::operator<<(poVar4,(string *)desc);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&sStack_208);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        ++specs_failed_;

        std::stringstream ss;
        ss << current_context_name() << " " << desc << ":" << std::endl
           << failure_formatter_.format(ex);
        failures_.push_back(ss.str());

        ++context_stack_.top().total;
        ++context_stack_.top().failed;
        --indentation_;
        stm_
            << "\r" << indent()
            << colorizer_.bad()
            << "[ FAIL ]"
            << colorizer_.reset()
            << " it " << desc
            << std::endl;
        stm_.flush();
      }